

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O2

LinearFunctionalConstraint * __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ExtractLinAndExprArgs
          (LinearFunctionalConstraint *__return_storage_ptr__,
          Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,LinTerms *ltin,LinTerms *ltout)

{
  LinTerms lt_in_expr;
  LinTerms local_190;
  LinTerms local_118;
  AffineExpr local_a0;
  
  SplitLinTerms(&local_118,this,ltin,ltout);
  LinTerms::LinTerms(&local_190,&local_118);
  LinTerms::LinTerms(&local_a0.super_LinTerms,&local_190);
  local_a0.constant_term_ = 0.0;
  LinearFunctionalConstraint::LinearFunctionalConstraint(__return_storage_ptr__,&local_a0);
  LinTerms::~LinTerms(&local_a0.super_LinTerms);
  LinTerms::~LinTerms(&local_190);
  LinTerms::~LinTerms(&local_118);
  return __return_storage_ptr__;
}

Assistant:

LinearFunctionalConstraint ExtractLinAndExprArgs(
      const LinTerms& ltin,
      LinTerms& ltout) {
    LinTerms lt_in_expr = SplitLinTerms(ltin.GetLinTerms(), ltout);
    return {{std::move(lt_in_expr), 0.0}};
  }